

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,CKey *key,CPubKey *pubkey)

{
  WalletStorage *pWVar1;
  array<unsigned_char,_32UL> *paVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *this_00;
  void *__dest;
  mapped_type *pmVar7;
  long lVar8;
  uint256 *puVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  size_t __n;
  long in_FS_OFFSET;
  byte bVar12;
  CKeyingMaterial secret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> crypted_secret;
  undefined8 *local_108;
  undefined8 uStack_100;
  code *local_f8;
  code *pcStack_f0;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_e8;
  CKeyID local_cc;
  uint256 local_b8 [2];
  uchar local_78;
  void *local_70;
  void *pvStack_68;
  long local_60;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_58;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
  iVar4 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((char)iVar4 != '\0') {
LAB_00228768:
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x90d,
                  "bool wallet::DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB(WalletBatch &, const CKey &, const CPubKey &)"
                 );
  }
  CPubKey::GetID((CKeyID *)local_b8,pubkey);
  iVar5 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::find(&(this->m_map_keys)._M_t,(key_type *)local_b8);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header) {
    CPubKey::GetID((CKeyID *)&local_58,pubkey);
    iVar6 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->m_map_crypted_keys)._M_t,(key_type *)&local_58);
    bVar3 = true;
    if ((_Rb_tree_header *)iVar6._M_node ==
        &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header) {
      iVar4 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
      if ((char)iVar4 == '\0') {
        CPubKey::GetID((CKeyID *)local_b8,pubkey);
        this_00 = std::
                  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                  ::operator[](&this->m_map_keys,(key_type *)local_b8);
        CKey::operator=(this_00,key);
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_b8,this);
        CKey::GetPrivKey((CPrivKey *)&local_58,key);
        bVar3 = WalletBatch::WriteDescriptorKey(batch,local_b8,pubkey,(CPrivKey *)&local_58);
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_58)
        ;
      }
      else {
        iVar4 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[10])();
        if ((char)iVar4 == '\0') {
          local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          paVar2 = (key->keydata)._M_t.
                   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
          local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_char,secure_allocator<unsigned_char>>::
          _M_range_initialize<unsigned_char_const*>
                    ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_e8,paVar2,
                     paVar2 + (paVar2 != (array<unsigned_char,_32UL> *)0x0));
          pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
          local_f8 = (code *)0x0;
          pcStack_f0 = (code *)0x0;
          local_108 = (undefined8 *)0x0;
          uStack_100 = 0;
          local_108 = (undefined8 *)operator_new(0x18);
          *local_108 = (vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_e8;
          local_108[1] = pubkey;
          local_108[2] = &local_58;
          pcStack_f0 = std::
                       _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2332:42)>
                       ::_M_invoke;
          local_f8 = std::
                     _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2332:42)>
                     ::_M_manager;
          iVar4 = (*pWVar1->_vptr_WalletStorage[8])(pWVar1);
          if (local_f8 != (code *)0x0) {
            (*local_f8)(&local_108,&local_108,3);
          }
          if ((char)iVar4 == '\0') {
            bVar3 = false;
          }
          else {
            memcpy(local_b8,pubkey,0x41);
            local_70 = (void *)0x0;
            pvStack_68 = (void *)0x0;
            local_60 = 0;
            uVar11 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58._M_impl.super__Vector_impl_data._M_start;
            if (uVar11 == 0) {
              __dest = (void *)0x0;
            }
            else {
              if ((long)uVar11 < 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_alloc();
                  goto LAB_00228768;
                }
                goto LAB_00228852;
              }
              __dest = operator_new(uVar11);
            }
            local_60 = uVar11 + (long)__dest;
            __n = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58._M_impl.super__Vector_impl_data._M_start;
            local_70 = __dest;
            if (__n != 0) {
              pvStack_68 = __dest;
              memmove(__dest,local_58._M_impl.super__Vector_impl_data._M_start,__n);
            }
            pvStack_68 = (void *)((long)__dest + __n);
            CPubKey::GetID(&local_cc,pubkey);
            pmVar7 = std::
                     map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ::operator[](&this->m_map_crypted_keys,&local_cc);
            puVar9 = local_b8;
            pmVar10 = pmVar7;
            for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
              *(undefined8 *)(pmVar10->first).vch =
                   *(undefined8 *)(puVar9->super_base_blob<256U>).m_data._M_elems;
              puVar9 = (uint256 *)((long)puVar9 + ((ulong)bVar12 * -2 + 1) * 8);
              pmVar10 = (mapped_type *)((long)pmVar10 + (ulong)bVar12 * -0x10 + 8);
            }
            (pmVar7->first).vch[0x40] = local_78;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                      (&pmVar7->second,&local_70);
            if (local_70 != (void *)0x0) {
              operator_delete(local_70,local_60 - (long)local_70);
            }
            (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_b8,this);
            bVar3 = WalletBatch::WriteCryptedDescriptorKey
                              (batch,local_b8,pubkey,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
          }
          std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                    (&local_e8);
          if (local_58._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          bVar3 = false;
        }
      }
    }
  }
  else {
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
LAB_00228852:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB(WalletBatch& batch, const CKey& key, const CPubKey &pubkey)
{
    AssertLockHeld(cs_desc_man);
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));

    // Check if provided key already exists
    if (m_map_keys.find(pubkey.GetID()) != m_map_keys.end() ||
        m_map_crypted_keys.find(pubkey.GetID()) != m_map_crypted_keys.end()) {
        return true;
    }

    if (m_storage.HasEncryptionKeys()) {
        if (m_storage.IsLocked()) {
            return false;
        }

        std::vector<unsigned char> crypted_secret;
        CKeyingMaterial secret{UCharCast(key.begin()), UCharCast(key.end())};
        if (!m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
                return EncryptSecret(encryption_key, secret, pubkey.GetHash(), crypted_secret);
            })) {
            return false;
        }

        m_map_crypted_keys[pubkey.GetID()] = make_pair(pubkey, crypted_secret);
        return batch.WriteCryptedDescriptorKey(GetID(), pubkey, crypted_secret);
    } else {
        m_map_keys[pubkey.GetID()] = key;
        return batch.WriteDescriptorKey(GetID(), pubkey, key.GetPrivKey());
    }
}